

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  int *piVar4;
  CURL *pCVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  CURLM *m;
  long lVar9;
  ulong uVar10;
  CURL **ppCVar11;
  long lVar12;
  timeval tVar13;
  timeval older;
  int maxfd;
  int running;
  long timeout;
  int msgs_left;
  fd_set exc;
  int filetime;
  char buf [200];
  int local_23c;
  int local_238;
  int local_234;
  __suseconds_t local_230;
  __time_t local_228;
  long local_220;
  timeval local_218;
  char *local_208;
  undefined1 local_1fc [4];
  fd_set local_1f8;
  fd_set local_178;
  fd_set local_f8;
  
  iVar1 = 0;
  num_handles = 0;
  blacklist_num_sites = 0;
  __stream = fopen64(libtest_arg2,"rb");
  if (__stream == (FILE *)0x0) {
    m = (CURLM *)0x0;
  }
  else {
    local_208 = URL;
    iVar1 = feof(__stream);
    if (iVar1 == 0) {
      do {
        iVar2 = __isoc99_fscanf(__stream,"%d %s\n",&local_178,&local_f8);
        iVar1 = num_handles;
        if (iVar2 == 0) {
          iVar1 = __isoc99_fscanf(__stream,"blacklist_site %s\n",&local_f8);
          if (iVar1 == 0) break;
          pcVar3 = strdup((char *)&local_f8);
          iVar1 = blacklist_num_sites;
          site_blacklist[blacklist_num_sites] = pcVar3;
          piVar4 = &blacklist_num_sites;
        }
        else {
          lVar9 = (long)num_handles;
          urltime[lVar9] = (int)local_178.__fds_bits[0];
          pcVar3 = strdup((char *)&local_f8);
          urlstring[lVar9] = pcVar3;
          piVar4 = &num_handles;
        }
        *piVar4 = iVar1 + 1;
        iVar1 = feof(__stream);
      } while (iVar1 == 0);
    }
    fclose(__stream);
    iVar1 = 0;
    site_blacklist[blacklist_num_sites] = (char *)0x0;
    server_blacklist[0] = (char *)0x0;
    m = (CURLM *)0x0;
    if (num_handles < 1) goto LAB_0010270d;
    tv_test_start = tutil_tvnow();
    curl_global_init(3);
    m = (CURLM *)curl_multi_init();
    if (m == (CURLM *)0x0) {
      m = (CURLM *)0x0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                    ,0x98);
      iVar1 = 0x7b;
    }
    else {
      if (0 < num_handles) {
        ppCVar11 = handles;
        lVar9 = 0;
        do {
          pCVar5 = (CURL *)curl_easy_init();
          *ppCVar11 = pCVar5;
          lVar9 = lVar9 + 1;
          ppCVar11 = ppCVar11 + 1;
        } while (lVar9 < num_handles);
      }
      iVar1 = curl_multi_setopt(m,3,1);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_multi_setopt(m,7,2);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_multi_setopt(m,8,3);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_multi_setopt(m,0x7539,15000);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_multi_setopt(m,0x753a,10000);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_multi_setopt(m,0x271b,site_blacklist);
                uVar8 = _stderr;
                if (iVar1 == 0) {
                  iVar1 = curl_multi_setopt(m,0x271c,server_blacklist);
                  uVar8 = _stderr;
                  if (iVar1 == 0) {
                    tVar13 = tutil_tvnow();
                    local_23c = 0;
                    do {
                      local_230 = tVar13.tv_usec;
                      local_228 = tVar13.tv_sec;
                      local_238 = -99;
                      local_218.tv_sec = 1;
                      local_218.tv_usec = 0;
                      if (local_23c < num_handles) {
                        tVar13 = tutil_tvnow();
                        older.tv_usec = local_230;
                        older.tv_sec = local_228;
                        lVar9 = tutil_tvdiff(tVar13,older);
                        if (urltime[local_23c] <= lVar9) {
                          local_230 = tVar13.tv_usec;
                          curl_mfprintf(_stdout,"Adding handle %d\n",local_23c);
                          setup_handle(local_208,m,local_23c);
                          local_23c = local_23c + 1;
                          local_228 = tVar13.tv_sec;
                        }
                        tVar13.tv_usec = local_230;
                        tVar13.tv_sec = local_228;
                      }
                      local_230 = tVar13.tv_usec;
                      local_228 = tVar13.tv_sec;
                      curl_multi_perform(m,&local_234);
                      tVar13 = tutil_tvnow();
                      lVar9 = tutil_tvdiff(tVar13,tv_test_start);
                      if (60000 < lVar9) {
                        uVar8 = 0xbd;
                        goto LAB_00102b02;
                      }
                      while( true ) {
                        piVar4 = (int *)curl_multi_info_read(m,local_1fc);
                        if (piVar4 == (int *)0x0) break;
                        if (*piVar4 == 1) {
                          if (num_handles < 1) {
                            uVar10 = 0;
                          }
                          else {
                            ppCVar11 = handles;
                            uVar10 = 0;
                            do {
                              if (*(CURL **)(piVar4 + 2) == *ppCVar11) goto LAB_001028c3;
                              uVar10 = uVar10 + 1;
                              ppCVar11 = ppCVar11 + 1;
                            } while ((uint)num_handles != uVar10);
                            uVar10 = (ulong)(uint)num_handles;
                          }
LAB_001028c3:
                          curl_mprintf("Handle %d Completed with status %d\n",uVar10 & 0xffffffff,
                                       piVar4[4]);
                          curl_multi_remove_handle(m,handles[uVar10 & 0xffffffff]);
                        }
                      }
                      if ((local_23c == num_handles) && (local_234 == 0)) {
                        iVar1 = 0;
                        goto LAB_001026d7;
                      }
                      local_f8.__fds_bits[0xe] = 0;
                      local_f8.__fds_bits[0xf] = 0;
                      local_f8.__fds_bits[0xc] = 0;
                      local_f8.__fds_bits[0xd] = 0;
                      local_f8.__fds_bits[10] = 0;
                      local_f8.__fds_bits[0xb] = 0;
                      local_f8.__fds_bits[8] = 0;
                      local_f8.__fds_bits[9] = 0;
                      local_f8.__fds_bits[6] = 0;
                      local_f8.__fds_bits[7] = 0;
                      local_f8.__fds_bits[4] = 0;
                      local_f8.__fds_bits[5] = 0;
                      local_f8.__fds_bits[2] = 0;
                      local_f8.__fds_bits[3] = 0;
                      local_f8.__fds_bits[0] = 0;
                      local_f8.__fds_bits[1] = 0;
                      local_178.__fds_bits[0] = 0;
                      local_178.__fds_bits[1] = 0;
                      local_178.__fds_bits[2] = 0;
                      local_178.__fds_bits[3] = 0;
                      local_178.__fds_bits[4] = 0;
                      local_178.__fds_bits[5] = 0;
                      local_178.__fds_bits[6] = 0;
                      local_178.__fds_bits[7] = 0;
                      local_178.__fds_bits[8] = 0;
                      local_178.__fds_bits[9] = 0;
                      local_178.__fds_bits[10] = 0;
                      local_178.__fds_bits[0xb] = 0;
                      local_178.__fds_bits[0xc] = 0;
                      local_178.__fds_bits[0xd] = 0;
                      local_178.__fds_bits[0xe] = 0;
                      local_178.__fds_bits[0xf] = 0;
                      local_1f8.__fds_bits[0] = 0;
                      local_1f8.__fds_bits[1] = 0;
                      local_1f8.__fds_bits[2] = 0;
                      local_1f8.__fds_bits[3] = 0;
                      local_1f8.__fds_bits[4] = 0;
                      local_1f8.__fds_bits[5] = 0;
                      local_1f8.__fds_bits[6] = 0;
                      local_1f8.__fds_bits[7] = 0;
                      local_1f8.__fds_bits[8] = 0;
                      local_1f8.__fds_bits[9] = 0;
                      local_1f8.__fds_bits[10] = 0;
                      local_1f8.__fds_bits[0xb] = 0;
                      local_1f8.__fds_bits[0xc] = 0;
                      local_1f8.__fds_bits[0xd] = 0;
                      local_1f8.__fds_bits[0xe] = 0;
                      local_1f8.__fds_bits[0xf] = 0;
                      curl_multi_fdset(m,&local_f8,&local_178,&local_1f8,&local_238);
                      curl_multi_timeout(m,&local_220);
                      if (local_220 < 0) {
                        local_220 = 1;
                      }
                      local_218.tv_sec = 0;
                      local_218.tv_usec = 1000;
                      iVar1 = select_wrapper(local_238 + 1,&local_f8,&local_178,&local_1f8,
                                             &local_218);
                      if (iVar1 == -1) {
                        piVar4 = __errno_location();
                        uVar8 = _stderr;
                        iVar1 = *piVar4;
                        pcVar3 = strerror(iVar1);
                        curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                      ,0xe8,iVar1,pcVar3);
                        iVar1 = 0x79;
                        goto LAB_001026d7;
                      }
                      tVar13 = tutil_tvnow();
                      lVar9 = tutil_tvdiff(tVar13,tv_test_start);
                      tVar13.tv_usec = local_230;
                      tVar13.tv_sec = local_228;
                    } while (lVar9 < 0xea61);
                    uVar8 = 0xea;
LAB_00102b02:
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                  ,uVar8);
                    iVar1 = 0x7d;
                    goto LAB_001026d7;
                  }
                  uVar6 = curl_multi_strerror(iVar1);
                  uVar7 = 0xa3;
                }
                else {
                  uVar6 = curl_multi_strerror(iVar1);
                  uVar7 = 0xa2;
                }
              }
              else {
                uVar6 = curl_multi_strerror(iVar1);
                uVar7 = 0xa0;
              }
            }
            else {
              uVar6 = curl_multi_strerror(iVar1);
              uVar7 = 0x9f;
            }
          }
          else {
            uVar6 = curl_multi_strerror(iVar1);
            uVar7 = 0x9e;
          }
        }
        else {
          uVar6 = curl_multi_strerror(iVar1);
          uVar7 = 0x9d;
        }
      }
      else {
        uVar6 = curl_multi_strerror(iVar1);
        uVar7 = 0x9c;
      }
      curl_mfprintf(uVar8,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                    ,uVar7,iVar1,uVar6);
    }
  }
LAB_001026d7:
  if (0 < num_handles) {
    ppCVar11 = handles;
    lVar9 = 0;
    iVar2 = num_handles;
    do {
      if (*ppCVar11 != (CURL *)0x0) {
        curl_easy_cleanup();
        iVar2 = num_handles;
      }
      lVar9 = lVar9 + 1;
      ppCVar11 = ppCVar11 + 1;
    } while (lVar9 < iVar2);
  }
LAB_0010270d:
  curl_multi_cleanup(m);
  curl_global_cleanup();
  lVar9 = (long)num_handles;
  if (0 < lVar9) {
    lVar12 = 0;
    do {
      free(*(void **)((long)urlstring + lVar12));
      *(undefined8 *)((long)urlstring + lVar12) = 0;
      lVar12 = lVar12 + 8;
    } while (lVar9 * 8 != lVar12);
  }
  lVar9 = (long)blacklist_num_sites;
  if (0 < lVar9) {
    lVar12 = 0;
    do {
      free(*(void **)((long)site_blacklist + lVar12));
      *(undefined8 *)((long)site_blacklist + lVar12) = 0;
      lVar12 = lVar12 + 8;
    } while (lVar9 * 8 != lVar12);
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int running;
  int handlenum = 0;
  struct timeval last_handle_add;

  if(parse_url_file(libtest_arg2) <= 0)
    goto test_cleanup;

  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  create_handles();

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);
  multi_setopt(m, CURLMOPT_MAX_HOST_CONNECTIONS, 2L);
  multi_setopt(m, CURLMOPT_MAX_PIPELINE_LENGTH, 3L);
  multi_setopt(m, CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE, 15000L);
  multi_setopt(m, CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE, 10000L);

  multi_setopt(m, CURLMOPT_PIPELINING_SITE_BL, site_blacklist);
  multi_setopt(m, CURLMOPT_PIPELINING_SERVER_BL, server_blacklist);

  last_handle_add = tutil_tvnow();

  for(;;) {
    struct timeval interval;
    struct timeval now;
    fd_set rd, wr, exc;
    int maxfd = -99;
    long timeout;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    if(handlenum < num_handles) {
      now = tutil_tvnow();
      if(tutil_tvdiff(now, last_handle_add) >= urltime[handlenum]) {
        fprintf(stdout, "Adding handle %d\n", handlenum);
        setup_handle(URL, m, handlenum);
        last_handle_add = now;
        handlenum++;
      }
    }

    curl_multi_perform(m, &running);

    abort_on_test_timeout();

    /* See how the transfers went */
    do {
      msg = curl_multi_info_read(m, &msgs_left);
      if(msg && msg->msg == CURLMSG_DONE) {
        int i, found = 0;

        /* Find out which handle this message is about */
        for(i = 0; i < num_handles; i++) {
          found = (msg->easy_handle == handles[i]);
          if(found)
            break;
        }

        printf("Handle %d Completed with status %d\n", i, msg->data.result);
        curl_multi_remove_handle(m, handles[i]);
      }
    } while(msg);

    if(handlenum == num_handles && !running) {
      break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    curl_multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    curl_multi_timeout(m, &timeout);

    if(timeout < 0)
      timeout = 1;

    interval.tv_sec = timeout / 1000;
    interval.tv_usec = (timeout % 1000) * 1000;

    interval.tv_sec = 0;
    interval.tv_usec = 1000;

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  remove_handles();

  /* undocumented cleanup sequence - type UB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  free_urls();
  return res;
}